

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O1

double __thiscall libDAI::TProb<double>::log(TProb<double> *this,double __x)

{
  iterator __position;
  double in_RAX;
  long lVar1;
  long *in_RSI;
  ulong uVar2;
  double dVar3;
  double local_28;
  
  dVar3 = 0.0;
  (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_28 = in_RAX;
  std::vector<double,_std::allocator<double>_>::reserve(&this->_p,in_RSI[1] - *in_RSI >> 3);
  lVar1 = *in_RSI;
  if (in_RSI[1] != lVar1) {
    uVar2 = 0;
    do {
      dVar3 = ::log(*(double *)(lVar1 + uVar2 * 8));
      __position._M_current =
           (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_28 = dVar3;
      if (__position._M_current ==
          (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->_p,__position,&local_28);
      }
      else {
        *__position._M_current = dVar3;
        (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar2 = uVar2 + 1;
      lVar1 = *in_RSI;
    } while (uVar2 < (ulong)(in_RSI[1] - lVar1 >> 3));
  }
  return dVar3;
}

Assistant:

TProb<T> log() const {
                TProb<T> l;
                l._p.reserve( size() );
                for( size_t i = 0; i < size(); i++ )
                    l._p.push_back( std::log( _p[i] ) );
                return l;
            }